

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

void make_constructors(GlobalVars *gv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long offset;
  char *secname;
  ObjectUnit *ou_00;
  ObjectUnit *pOVar4;
  long in_RDI;
  ObjectUnit *ou;
  uint8_t *data;
  PriPointer *pp;
  unsigned_long dlen;
  unsigned_long clen;
  char *dsecname;
  char *csecname;
  bool dtors;
  bool ctors;
  int ndtors;
  int nctors;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  long *plVar5;
  GlobalVars *gv_00;
  char *pcVar6;
  Symbol *labelsym;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  if ((*(int *)(in_RDI + 0x5c) == 0) &&
     ((*(long *)(in_RDI + 0x228) != 0 || (*(long *)(in_RDI + 0x230) != 0)))) {
    iVar10 = 0;
    iVar9 = 0;
    iVar8 = 0;
    iVar7 = 0;
    labelsym = (Symbol *)0x0;
    pcVar6 = (char *)0x0;
    if ((*(long *)(in_RDI + 0x228) != 0) && ((*(byte *)(*(long *)(in_RDI + 0x228) + 0x41) & 2) != 0)
       ) {
      iVar8 = 1;
      for (plVar5 = *(long **)(in_RDI + 0x1c0); *plVar5 != 0; plVar5 = (long *)*plVar5) {
        iVar1 = strcmp((char *)plVar5[3],*(char **)(*(long *)(in_RDI + 0x228) + 0x20));
        if (iVar1 == 0) {
          if (labelsym == (Symbol *)0x0) {
            labelsym = (Symbol *)plVar5[2];
          }
          else {
            iVar1 = strcmp((char *)labelsym,(char *)plVar5[2]);
            if (iVar1 != 0) {
              error(0x7d);
            }
          }
        }
      }
      if (labelsym == (Symbol *)0x0) {
        labelsym = (Symbol *)
                   xtors_secname((GlobalVars *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff88);
      }
    }
    if ((*(long *)(in_RDI + 0x230) != 0) && ((*(byte *)(*(long *)(in_RDI + 0x230) + 0x41) & 2) != 0)
       ) {
      iVar7 = 1;
      for (plVar5 = *(long **)(in_RDI + 0x1c0); *plVar5 != 0; plVar5 = (long *)*plVar5) {
        iVar1 = strcmp((char *)plVar5[3],*(char **)(*(long *)(in_RDI + 0x230) + 0x20));
        if (iVar1 == 0) {
          if (pcVar6 == (char *)0x0) {
            pcVar6 = (char *)plVar5[2];
          }
          else {
            iVar1 = strcmp(pcVar6,(char *)plVar5[2]);
            if (iVar1 != 0) {
              error(0x7d);
            }
          }
        }
      }
      if (pcVar6 == (char *)0x0) {
        pcVar6 = xtors_secname((GlobalVars *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88);
      }
    }
    if ((iVar8 != 0) || (iVar7 != 0)) {
      for (gv_00 = *(GlobalVars **)(in_RDI + 0x1c0); iVar1 = (int)((ulong)pcVar6 >> 0x20),
          (gv_00->libpaths).first != (node *)0x0; gv_00 = (GlobalVars *)(gv_00->libpaths).first) {
        if ((iVar8 != 0) &&
           (iVar1 = strcmp((char *)(gv_00->inputlist).first,
                           *(char **)(*(long *)(in_RDI + 0x228) + 0x20)), iVar1 == 0)) {
          iVar10 = iVar10 + 1;
        }
        if ((iVar7 != 0) &&
           (iVar1 = strcmp((char *)(gv_00->inputlist).first,
                           *(char **)(*(long *)(in_RDI + 0x230) + 0x20)), iVar1 == 0)) {
          iVar9 = iVar9 + 1;
        }
      }
      if (iVar8 == 0) {
        iVar2 = 0;
      }
      else {
        iVar2 = iVar10 + 2;
      }
      offset = (long)((int)fff[*(byte *)(in_RDI + 0x58)]->addr_bits / 8) * (long)iVar2;
      pcVar6 = (char *)(long)((int)fff[*(byte *)(in_RDI + 0x58)]->addr_bits / 8);
      if (iVar7 == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = iVar9 + 2;
      }
      secname = (char *)((long)pcVar6 * (long)iVar3);
      ou_00 = (ObjectUnit *)alloczero(CONCAT44(iVar3,in_stack_ffffffffffffff90));
      pOVar4 = art_objunit((GlobalVars *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),pcVar6,
                           (uint8_t *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
                           (unsigned_long)in_stack_ffffffffffffff88);
      if (iVar8 != 0) {
        write_constructors((GlobalVars *)CONCAT44(iVar10,iVar9),(ObjectUnit *)CONCAT44(iVar8,iVar7),
                           labelsym,iVar1,offset,secname);
      }
      if (iVar7 != 0) {
        write_constructors((GlobalVars *)CONCAT44(iVar10,iVar9),(ObjectUnit *)CONCAT44(iVar8,iVar7),
                           labelsym,iVar1,offset,secname);
      }
      pOVar4->lnkfile->type = '\x01';
      add_objunit(gv_00,ou_00,(bool)((ulong)pOVar4 >> 0x20));
    }
  }
  return;
}

Assistant:

void make_constructors(struct GlobalVars *gv)
/* Create an artificial object for constructor/destructor lists
   and fill them will entries from the PriPointer list. */
{
  if (!gv->dest_object && (gv->ctor_symbol || gv->dtor_symbol)) {
    int nctors=0,ndtors=0;
    bool ctors=FALSE,dtors=FALSE;
    const char *csecname=NULL,*dsecname=NULL;
    unsigned long clen,dlen;
    struct PriPointer *pp;
    uint8_t *data;
    struct ObjectUnit *ou;

    /* check if constructors or destructors are needed (referenced) */
    if (gv->ctor_symbol) {
      if (gv->ctor_symbol->flags & SYMF_REFERENCED) {
        ctors = TRUE;
        for (pp=(struct PriPointer *)gv->pripointers.first;
             pp->n.next!=NULL; pp=(struct PriPointer *)pp->n.next) {
          if (!strcmp(pp->listname,gv->ctor_symbol->name)) {
            if (csecname) {
              if (strcmp(csecname,pp->secname))
                error(125);  /* CTORS/DTORS spread over multiple sections */
            }
            else
              csecname = pp->secname;
          }
        }
        if (!csecname)
          csecname = xtors_secname(gv,ctors_name);
      }
    }
    if (gv->dtor_symbol) {
      if (gv->dtor_symbol->flags & SYMF_REFERENCED) {
        dtors = TRUE;
        for (pp=(struct PriPointer *)gv->pripointers.first;
             pp->n.next!=NULL; pp=(struct PriPointer *)pp->n.next) {
          if (!strcmp(pp->listname,gv->dtor_symbol->name)) {
            if (dsecname) {
              if (strcmp(dsecname,pp->secname))
                error(125);  /* CTORS/DTORS spread over multiple sections */
            }
            else
              dsecname = pp->secname;
          }
        }
        if (!dsecname)
          dsecname = xtors_secname(gv,dtors_name);
      }
    }
    if (!ctors && !dtors)
      return;

    /* count number of constructor and destructor pointers */
    for (pp=(struct PriPointer *)gv->pripointers.first;
         pp->n.next!=NULL; pp=(struct PriPointer *)pp->n.next) {
      if (ctors) {
        if (!strcmp(pp->listname,gv->ctor_symbol->name))
          nctors++;
      }
      if (dtors) {
        if (!strcmp(pp->listname,gv->dtor_symbol->name))
          ndtors++;
      }
    }

    /* create artificial object */
    clen = (unsigned long)(fff[gv->dest_format]->addr_bits / 8) *
            (ctors ? nctors+2 : 0);
    dlen = (unsigned long)(fff[gv->dest_format]->addr_bits / 8) *
            (dtors ? ndtors+2 : 0);
    data = alloczero(clen + dlen);
    ou = art_objunit(gv,"INITEXIT",data,clen+dlen);

    /* write constructors/destructors */
    if (ctors)
      write_constructors(gv,ou,gv->ctor_symbol,nctors,0,csecname);
    if (dtors)
      write_constructors(gv,ou,gv->dtor_symbol,ndtors,clen,dsecname);

    /* enqueue artificial object unit into linking process */
    ou->lnkfile->type = ID_OBJECT;
    add_objunit(gv,ou,FALSE);
  }
}